

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

EStatusCode __thiscall
CFFFileInput::ReadDict
          (CFFFileInput *this,unsigned_long inReadAmount,UShortToDictOperandListMap *outDict)

{
  _List_node_base *p_Var1;
  bool bVar2;
  EStatusCode EVar3;
  LongFilePositionType LVar4;
  LongFilePositionType LVar5;
  _List_node_base *p_Var6;
  CFFPrimitiveReader *this_00;
  Byte aBuffer;
  unsigned_short anOperator;
  DictOperand anOperand;
  Byte local_8b;
  unsigned_short local_8a;
  _List_node_base local_88;
  long local_78;
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>,std::_Select1st<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>>
  *local_70;
  pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>
  local_68;
  _List_node_base *local_48;
  anon_union_8_2_3d487603_for_DictOperand_1 aStack_40;
  _List_node_base *local_38;
  
  this_00 = &this->mPrimitivesReader;
  local_70 = (_Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>,std::_Select1st<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>>
              *)outDict;
  LVar4 = CFFPrimitiveReader::GetCurrentPosition(this_00);
  local_78 = 0;
  local_88._M_next = &local_88;
  local_88._M_prev = &local_88;
  while (LVar5 = CFFPrimitiveReader::GetCurrentPosition(this_00), LVar5 - LVar4 < (long)inReadAmount
        ) {
    EVar3 = CFFPrimitiveReader::ReadByte(this_00,&local_8b);
    p_Var6 = local_88._M_next;
    if (EVar3 != eSuccess) goto joined_r0x0019e46a;
    bVar2 = CFFPrimitiveReader::IsDictOperator(this_00,local_8b);
    if (bVar2) {
      EVar3 = CFFPrimitiveReader::ReadDictOperator(this_00,local_8b,&local_8a);
      p_Var6 = local_88._M_next;
      if (EVar3 != eSuccess) goto joined_r0x0019e46a;
      local_68.first = local_8a;
      std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::list
                (&local_68.second,(list<DictOperand,_std::allocator<DictOperand>_> *)&local_88);
      std::
      _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>,std::_Select1st<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>>
      ::
      _M_insert_unique<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>
                (local_70,&local_68);
      p_Var6 = local_68.second.super__List_base<DictOperand,_std::allocator<DictOperand>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      while (p_Var1 = local_88._M_next, p_Var6 != (_List_node_base *)&local_68.second) {
        p_Var1 = p_Var6->_M_next;
        operator_delete(p_Var6,0x28);
        p_Var6 = p_Var1;
      }
      while (p_Var1 != &local_88) {
        p_Var6 = (((_List_base<DictOperand,_std::allocator<DictOperand>_> *)&p_Var1->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var1,0x28);
        p_Var1 = p_Var6;
      }
      local_78 = 0;
      local_88._M_next = &local_88;
      local_88._M_prev = &local_88;
    }
    else {
      EVar3 = CFFPrimitiveReader::ReadDictOperand(this_00,local_8b,(DictOperand *)&local_48);
      p_Var6 = local_88._M_next;
      if (EVar3 != eSuccess) goto joined_r0x0019e46a;
      p_Var6 = (_List_node_base *)operator_new(0x28);
      p_Var6[2]._M_next = local_38;
      p_Var6[1]._M_next = local_48;
      p_Var6[1]._M_prev = (_List_node_base *)aStack_40;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      local_78 = local_78 + 1;
    }
  }
  EVar3 = eSuccess;
  p_Var6 = local_88._M_next;
joined_r0x0019e46a:
  while (p_Var6 != &local_88) {
    p_Var1 = p_Var6->_M_next;
    operator_delete(p_Var6,0x28);
    p_Var6 = p_Var1;
  }
  return EVar3;
}

Assistant:

EStatusCode CFFFileInput::ReadDict(unsigned long inReadAmount,UShortToDictOperandListMap& outDict)
{
	LongFilePositionType dictStartPosition = mPrimitivesReader.GetCurrentPosition();
	DictOperandList operands;
	EStatusCode status = PDFHummus::eSuccess;
	unsigned short anOperator;
	DictOperand anOperand;
	Byte aBuffer;

	while(PDFHummus::eSuccess == status && 
			(mPrimitivesReader.GetCurrentPosition() - dictStartPosition < (long long)inReadAmount))
	{
		status = mPrimitivesReader.ReadByte(aBuffer);
		if(status != PDFHummus::eSuccess)
			break;
		if(mPrimitivesReader.IsDictOperator(aBuffer))
		{ // operator
			status = mPrimitivesReader.ReadDictOperator(aBuffer,anOperator);
			if(status != PDFHummus::eSuccess)
				break;
			outDict.insert(
				UShortToDictOperandListMap::value_type(anOperator,operands));
			operands.clear();
		}
		else // operand
		{
			status = mPrimitivesReader.ReadDictOperand(aBuffer,anOperand);
			if(status != PDFHummus::eSuccess)
				break;
			operands.push_back(anOperand);
		}
	}

	return status;
}